

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

void __thiscall
NNTreeIterator::resetLimits(NNTreeIterator *this,QPDFObjectHandle *node,iterator parent)

{
  element_type *peVar1;
  NNTreeDetails *pNVar2;
  QPDF *qpdf;
  bool bVar3;
  undefined8 uVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _List_node_base *p_Var6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  QPDFObjectHandle QVar13;
  QPDFObjectHandle ofirst;
  QPDFObjectHandle first_limits;
  QPDFObjectHandle last_kid;
  QPDFObjectHandle last;
  QPDFObjectHandle first;
  QPDFObjectHandle first_kid;
  QPDFObjectHandle last_limits;
  QPDFObjectHandle items;
  QPDFObjectHandle kids;
  undefined1 local_168 [47];
  char local_139;
  string *local_138;
  NNTreeIterator *local_130;
  QPDFObjectHandle local_128;
  string local_118;
  QPDFObjectHandle local_f8;
  _List_node_base *local_e8;
  undefined1 local_e0 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  QPDFObjGen local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFObjectHandle local_50;
  QPDFObjectHandle local_40;
  
  local_e0._16_8_ = &this->path;
  peVar1 = (element_type *)(local_168 + 0x10);
  local_58 = &(node->super_BaseHandle).obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  bVar12 = false;
  local_138 = (string *)node;
  local_130 = this;
  local_e8 = parent._M_node;
  do {
    local_168._0_8_ = peVar1;
    if (local_e8 == (_List_node_base *)local_e0._16_8_) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/Limits","");
      QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_138,(string *)local_168);
      if ((element_type *)local_168._0_8_ == peVar1) {
        return;
      }
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      return;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/Kids","");
    QPDFObjectHandle::getKey(&local_40,local_138);
    if ((element_type *)local_168._0_8_ != peVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    bVar7 = QPDFObjectHandle::isArray(&local_40);
    iVar10 = 0;
    if (bVar7) {
      iVar10 = QPDFObjectHandle::getArrayNItems(&local_40);
    }
    (*(code *)**(undefined8 **)local_130->impl->details)();
    QPDFObjectHandle::getKey(&local_50,local_138);
    bVar7 = QPDFObjectHandle::isArray(&local_50);
    iVar11 = 0;
    if (bVar7) {
      iVar11 = QPDFObjectHandle::getArrayNItems(&local_50);
    }
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118.field_2._M_allocated_capacity = 0;
    local_118.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (iVar11 < 2) {
      if (0 < iVar10) {
        iVar10 = (int)&local_40;
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_e0,iVar10);
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_118,iVar10);
        bVar7 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_e0);
        if ((bVar7) &&
           (bVar7 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_118), bVar7)) {
          local_168._0_8_ = peVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/Limits","");
          QPDFObjectHandle::getKey(&local_128,(string *)local_e0);
          if ((element_type *)local_168._0_8_ != peVar1) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
          local_168._0_8_ = peVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/Limits","");
          QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_e0 + 0x18),&local_118);
          if ((element_type *)local_168._0_8_ != peVar1) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
          bVar7 = QPDFObjectHandle::isArray(&local_128);
          if ((((bVar7) && (iVar10 = QPDFObjectHandle::getArrayNItems(&local_128), 1 < iVar10)) &&
              (bVar7 = QPDFObjectHandle::isArray((QPDFObjectHandle *)(local_e0 + 0x18)), bVar7)) &&
             (iVar10 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)(local_e0 + 0x18)),
             1 < iVar10)) {
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,(int)&local_128);
            _Var5._M_pi = local_f8.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi;
            local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
            local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_168._0_8_;
            local_168._0_8_ = (element_type *)0x0;
            local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
            }
            QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,(int)local_e0 + 0x18);
            uVar4 = local_118.field_2._8_8_;
            local_118.field_2._8_8_ = local_168._8_8_;
            local_118.field_2._M_allocated_capacity = local_168._0_8_;
            local_168._0_8_ = (element_type *)0x0;
            local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
            }
          }
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          if (local_128.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
          this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_;
        }
        goto LAB_0012cd97;
      }
    }
    else {
      iVar10 = (int)&local_50;
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,iVar10);
      _Var5._M_pi = local_f8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
      local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_168._0_8_;
      local_168._0_8_ = (element_type *)0x0;
      local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
      }
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,iVar10);
      uVar4 = local_118.field_2._8_8_;
      local_118.field_2._8_8_ = local_168._8_8_;
      local_118.field_2._M_allocated_capacity = local_168._0_8_;
      local_168._0_8_ = (element_type *)0x0;
      local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
      }
LAB_0012cd97:
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if ((local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr == (element_type *)0x0) ||
       ((element_type *)local_118.field_2._M_allocated_capacity == (element_type *)0x0)) {
      qpdf = local_130->impl->qpdf;
      local_168._0_8_ = peVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"unable to determine limits","");
      warn(qpdf,(QPDFObjectHandle *)local_138,(string *)local_168);
      if ((element_type *)local_168._0_8_ != peVar1) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
      if (local_e8 == *(_List_node_base **)local_e0._16_8_) goto LAB_0012d15f;
LAB_0012d110:
      p_Var6 = local_e8;
      (((BaseHandle *)&local_138->_M_dataplus)->obj).
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8[1]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (local_58,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8[1]._M_prev);
      local_e8 = p_Var6->_M_prev;
    }
    else {
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_e0,&local_f8);
      QPDFObjectHandle::appendItem
                ((QPDFObjectHandle *)local_e0,(QPDFObjectHandle *)&local_118.field_2);
      local_168._0_8_ = peVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/Limits","");
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_118,local_138);
      if ((element_type *)local_168._0_8_ != peVar1) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
      bVar8 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_118);
      bVar7 = true;
      if ((bVar8) &&
         (iVar10 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&local_118), iVar10 == 2)) {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_168,(int)&local_118);
        QVar13 = QPDFObjectHandle::getArrayItem(&local_128,(int)&local_118);
        pNVar2 = local_130->impl->details;
        local_68 = (element_type *)local_168._0_8_;
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
          }
        }
        local_139 = (**(code **)(*(long *)pNVar2 + 8))
                              (pNVar2,&local_68,
                               QVar13.super_BaseHandle.obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
        bVar7 = true;
        if (local_139 == '\0') {
LAB_0012cfdb:
          bVar3 = false;
          bVar8 = false;
        }
        else {
          pNVar2 = local_130->impl->details;
          local_78 = local_128.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_70 = local_128.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_128.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_128.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_128.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_128.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_128.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          cVar9 = (**(code **)(*(long *)pNVar2 + 8))(pNVar2,&local_78);
          if (cVar9 == '\0') goto LAB_0012cfdb;
          pNVar2 = local_130->impl->details;
          local_88 = local_f8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_80 = local_f8.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_f8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_f8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_f8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_f8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_f8.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          local_98 = (element_type *)local_168._0_8_;
          local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_168._8_8_ + 8) = *(_Atomic_word *)(local_168._8_8_ + 8) + 1;
            }
          }
          iVar10 = (**(code **)(*(long *)pNVar2 + 0x10))(pNVar2,&local_88,&local_98);
          if (iVar10 == 0) {
            pNVar2 = local_130->impl->details;
            local_a8.obj = local_118.field_2._M_allocated_capacity._0_4_;
            local_a8.gen = local_118.field_2._M_allocated_capacity._4_4_;
            local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_118.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_118.field_2._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_118.field_2._8_8_ + 8) =
                     *(_Atomic_word *)(local_118.field_2._8_8_ + 8) + 1;
              }
            }
            local_b8 = local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_b0 = local_128.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (local_128.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_128.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_128.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_128.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count = (local_128.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            iVar10 = (**(code **)(*(long *)pNVar2 + 0x10))(pNVar2,&local_a8,&local_b8);
            bVar7 = iVar10 != 0;
            bVar3 = true;
            bVar8 = true;
          }
          else {
            bVar3 = true;
            bVar8 = false;
            bVar7 = true;
          }
        }
        if (bVar8) {
          if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
        }
        cVar9 = local_139;
        if (bVar3) {
          if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
        }
        if ((cVar9 != '\0') && (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        }
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
        if (local_128.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_128.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
        }
      }
      if (bVar7) {
        local_168._0_8_ = peVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/Limits","");
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)local_138,(string *)local_168,(QPDFObjectHandle *)local_e0);
        if ((element_type *)local_168._0_8_ != peVar1) {
          operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
        }
        if ((bool)(bVar7 & local_e8 != *(_List_node_base **)local_e0._16_8_)) goto LAB_0012d110;
      }
      else {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._M_string_length);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
        }
      }
LAB_0012d15f:
      bVar12 = true;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.field_2._8_8_);
    }
    if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (bVar12) {
      return;
    }
  } while( true );
}

Assistant:

void
NNTreeIterator::resetLimits(QPDFObjectHandle node, std::list<PathElement>::iterator parent)
{
    bool done = false;
    while (!done) {
        if (parent == this->path.end()) {
            QTC::TC("qpdf", "NNTree remove limits from root");
            node.removeKey("/Limits");
            done = true;
            break;
        }
        auto kids = node.getKey("/Kids");
        int nkids = kids.isArray() ? kids.getArrayNItems() : 0;
        auto items = node.getKey(impl.details.itemsKey());
        int nitems = items.isArray() ? items.getArrayNItems() : 0;

        bool changed = true;
        QPDFObjectHandle first;
        QPDFObjectHandle last;
        if (nitems >= 2) {
            first = items.getArrayItem(0);
            last = items.getArrayItem((nitems - 1) & ~1);
        } else if (nkids > 0) {
            auto first_kid = kids.getArrayItem(0);
            auto last_kid = kids.getArrayItem(nkids - 1);
            if (first_kid.isDictionary() && last_kid.isDictionary()) {
                auto first_limits = first_kid.getKey("/Limits");
                auto last_limits = last_kid.getKey("/Limits");
                if (first_limits.isArray() && (first_limits.getArrayNItems() >= 2) &&
                    last_limits.isArray() && (last_limits.getArrayNItems() >= 2)) {
                    first = first_limits.getArrayItem(0);
                    last = last_limits.getArrayItem(1);
                }
            }
        }
        if (first && last) {
            auto limits = QPDFObjectHandle::newArray();
            limits.appendItem(first);
            limits.appendItem(last);
            auto olimits = node.getKey("/Limits");
            if (olimits.isArray() && (olimits.getArrayNItems() == 2)) {
                auto ofirst = olimits.getArrayItem(0);
                auto olast = olimits.getArrayItem(1);
                if (impl.details.keyValid(ofirst) && impl.details.keyValid(olast) &&
                    (impl.details.compareKeys(first, ofirst) == 0) &&
                    (impl.details.compareKeys(last, olast) == 0)) {
                    QTC::TC("qpdf", "NNTree limits didn't change");
                    changed = false;
                }
            }
            if (changed) {
                node.replaceKey("/Limits", limits);
            }
        } else {
            QTC::TC("qpdf", "NNTree unable to determine limits");
            warn(impl.qpdf, node, "unable to determine limits");
        }

        if ((!changed) || (parent == this->path.begin())) {
            done = true;
        } else {
            node = parent->node;
            --parent;
        }
    }
}